

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<duckdb::SQLIdentifier,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,SQLIdentifier *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  pointer pEVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_00;
  undefined1 local_a8 [32];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  ExceptionFormatValue local_68;
  
  pEVar1 = (values->
           super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  param_00 = &param->raw_string;
  local_88[0] = local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pEVar1,
             &((values->
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               )._M_impl.super__Vector_impl_data._M_finish)->type + (long)pEVar1);
  ExceptionFormatValue::CreateFormatValue<duckdb::SQLIdentifier>
            (&local_68,(SQLIdentifier *)local_88);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.str_val._M_dataplus._M_p != &local_68.str_val.field_2) {
    operator_delete(local_68.str_val._M_dataplus._M_p);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  pcVar2 = (param->raw_string)._M_dataplus._M_p;
  local_a8._0_8_ = (pointer)(local_a8 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar2,pcVar2 + (param->raw_string)._M_string_length);
  ConstructMessageRecursive<std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             local_a8,param_00);
  if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}